

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall
kratos::InstantiationStmt::process_port
          (InstantiationStmt *this,Port *port,Generator *parent,string *target_name)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  VarException *pVVar2;
  InternalException *pIVar3;
  undefined8 uVar4;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pair<std::_Rb_tree_iterator<std::pair<kratos::Port_*const,_kratos::Var_*>_>,_bool> pVar5;
  pair<std::_Rb_tree_iterator<std::pair<kratos::Var_*const,_kratos::Stmt_*>_>,_bool> pVar6;
  basic_string_view<char> bVar7;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  undefined1 local_d0 [56];
  Port *local_98;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  local_90;
  string local_78;
  undefined1 auStack_58 [8];
  value_type stmt;
  Port *local_38;
  Port *port_local;
  
  local_38 = port;
  if (port->direction_ == Out) {
    filter_slice_pairs_with_target
              ((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                *)&local_78,&(port->super_Var).slices_,parent,true);
    iVar1 = (*(local_38->super_Var).super_IRNode._vptr_IRNode[0xe])();
    filter_assignments_with_target
              ((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)local_d0,
               (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)CONCAT44(extraout_var_00,iVar1),parent,true);
    if (local_78._M_dataplus._M_p != (pointer)local_78._M_string_length) {
      pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_58,
                 "Output slices not supported in the statement. Please run a de-couple pass first",
                 (allocator<char> *)&local_90);
      InternalException::InternalException(pIVar3,(string *)auStack_58);
      __cxa_throw(pIVar3,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_d0._24_8_ != 0) {
      if (local_d0._24_8_ != 1) {
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)auStack_58,
                   "Multiple outputs not supported in the statement. Please run a de-couple pass first"
                   ,(allocator<char> *)&local_90);
        InternalException::InternalException(pIVar3,(string *)auStack_58);
        __cxa_throw(pIVar3,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)auStack_58,
                 (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_d0._16_8_ + 8));
      std::
      _Rb_tree<kratos::Port*,std::pair<kratos::Port*const,kratos::Var*>,std::_Select1st<std::pair<kratos::Port*const,kratos::Var*>>,std::less<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,kratos::Var*>>>
      ::_M_emplace_unique<kratos::Port*&,kratos::Var*&>
                ((_Rb_tree<kratos::Port*,std::pair<kratos::Port*const,kratos::Var*>,std::_Select1st<std::pair<kratos::Port*const,kratos::Var*>>,std::less<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,kratos::Var*>>>
                  *)&this->port_mapping_,&local_38,(Var **)((long)auStack_58 + 0xc0));
      (**(code **)(*(long *)auStack_58 + 0x48))();
      if (parent->debug == true) {
        local_90.
        super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_58;
        std::
        _Rb_tree<kratos::Var*,std::pair<kratos::Var*const,kratos::Stmt*>,std::_Select1st<std::pair<kratos::Var*const,kratos::Stmt*>>,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Stmt*>>>
        ::_M_emplace_unique<kratos::Port*&,kratos::AssignStmt*>
                  ((_Rb_tree<kratos::Var*,std::pair<kratos::Var*const,kratos::Stmt*>,std::_Select1st<std::pair<kratos::Var*const,kratos::Stmt*>>,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Stmt*>>>
                    *)&this->port_debug_,&local_38,(AssignStmt **)&local_90);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
    }
    std::
    _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_d0);
    this_00 = &local_78;
  }
  else {
    if (port->direction_ != In) {
      pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d0,"Inout port type not implemented",(allocator<char> *)auStack_58)
      ;
      InternalException::InternalException(pIVar3,(string *)local_d0);
      __cxa_throw(pIVar3,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    filter_slice_pairs_with_target(&local_90,&(port->super_Var).slices_,parent,false);
    iVar1 = (*(local_38->super_Var).super_IRNode._vptr_IRNode[0x10])();
    filter_assignments_with_target
              ((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)local_d0,
               (unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)CONCAT44(extraout_var,iVar1),parent,false);
    if (local_90.
        super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_90.
        super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_58,
                 "Input slices not supported in the statement. Please run a de-couple pass first",
                 (allocator<char> *)&local_78);
      InternalException::InternalException(pIVar3,(string *)auStack_58);
      __cxa_throw(pIVar3,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_d0._24_8_ != 1) {
      if (local_d0._24_8_ == 0) {
        pVVar2 = (VarException *)__cxa_allocate_exception(0x10);
        auStack_58 = (undefined1  [8])(target_name->_M_dataplus)._M_p;
        stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)target_name->_M_string_length;
        stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(port->super_Var).name._M_dataplus._M_p
        ;
        bVar7 = fmt::v7::to_string_view<char,_0>("{0}.{1} is not connected");
        format_str.data_ = (char *)bVar7.size_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_58;
        format_str.size_ = 0xdd;
        fmt::v7::detail::vformat_abi_cxx11_(&local_78,(detail *)bVar7.data_,format_str,args);
        local_98 = local_38;
        __l._M_len = 1;
        __l._M_array = (iterator)&local_98;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   auStack_58,__l,(allocator_type *)((long)&port_local + 7));
        VarException::VarException
                  (pVVar2,&local_78,
                   (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   auStack_58);
        __cxa_throw(pVVar2,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
      pVVar2 = (VarException *)__cxa_allocate_exception(0x10);
      auStack_58 = (undefined1  [8])(target_name->_M_dataplus)._M_p;
      stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)target_name->_M_string_length;
      stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(port->super_Var).name._M_dataplus._M_p;
      bVar7 = fmt::v7::to_string_view<char,_0>("{0}.{1} is driven by multiple nets");
      format_str_00.data_ = (char *)bVar7.size_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_58;
      format_str_00.size_ = 0xdd;
      fmt::v7::detail::vformat_abi_cxx11_(&local_78,(detail *)bVar7.data_,format_str_00,args_00);
      local_98 = local_38;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_98;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 auStack_58,__l_00,(allocator_type *)((long)&port_local + 7));
      VarException::VarException
                (pVVar2,&local_78,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 auStack_58);
      __cxa_throw(pVVar2,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    pVar5 = std::
            _Rb_tree<kratos::Port*,std::pair<kratos::Port*const,kratos::Var*>,std::_Select1st<std::pair<kratos::Port*const,kratos::Var*>>,std::less<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,kratos::Var*>>>
            ::_M_emplace_unique<kratos::Port*&,kratos::Var*&>
                      ((_Rb_tree<kratos::Port*,std::pair<kratos::Port*const,kratos::Var*>,std::_Select1st<std::pair<kratos::Port*const,kratos::Var*>>,std::less<kratos::Port*>,std::allocator<std::pair<kratos::Port*const,kratos::Var*>>>
                        *)&this->port_mapping_,&local_38,
                       (Var **)(((_Hash_node_base *)(local_d0._16_8_ + 8))->_M_nxt + 0x19));
    uVar4 = pVar5._8_8_;
    if (parent->debug == true) {
      auStack_58 = (undefined1  [8])((_Hash_node_base *)(local_d0._16_8_ + 8))->_M_nxt;
      pVar6 = std::
              _Rb_tree<kratos::Var*,std::pair<kratos::Var*const,kratos::Stmt*>,std::_Select1st<std::pair<kratos::Var*const,kratos::Stmt*>>,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Stmt*>>>
              ::_M_emplace_unique<kratos::Port*&,kratos::AssignStmt*>
                        ((_Rb_tree<kratos::Var*,std::pair<kratos::Var*const,kratos::Stmt*>,std::_Select1st<std::pair<kratos::Var*const,kratos::Stmt*>>,std::less<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Stmt*>>>
                          *)&this->port_debug_,&local_38,(AssignStmt **)auStack_58);
      uVar4 = pVar6._8_8_;
    }
    auStack_58 = (undefined1  [8])((_Hash_node_base *)(local_d0._16_8_ + 8))->_M_nxt;
    std::
    _Hashtable<kratos::AssignStmt*,kratos::AssignStmt*,std::allocator<kratos::AssignStmt*>,std::__detail::_Identity,std::equal_to<kratos::AssignStmt*>,std::hash<kratos::AssignStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<kratos::AssignStmt*>
              ((_Hashtable<kratos::AssignStmt*,kratos::AssignStmt*,std::allocator<kratos::AssignStmt*>,std::__detail::_Identity,std::equal_to<kratos::AssignStmt*>,std::hash<kratos::AssignStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->connection_stmt_,auStack_58,uVar4);
    (*(code *)((_Hash_node_base *)(local_d0._16_8_ + 8))->_M_nxt->_M_nxt[9]._M_nxt)();
    std::
    _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_d0);
    this_00 = (string *)&local_90;
  }
  std::
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>::
  ~vector((vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           *)this_00);
  return;
}

Assistant:

void InstantiationStmt::process_port(kratos::Port *port, Generator *parent,
                                     const std::string &target_name) {
    auto const port_direction = port->port_direction();
    auto const &port_name = port->name;
    if (port_direction == PortDirection::In) {
        // if we're connected to a base variable and no slice, we are good
        const auto &slices = filter_slice_pairs_with_target(port->get_slices(), parent, false);
        const auto &sources = filter_assignments_with_target(port->sources(), parent, false);
        // because an input cannot be an register, it can only has one
        // source (all bits combined)
        if (slices.empty()) {
            if (sources.empty())
                throw VarException(::format("{0}.{1} is not connected", target_name, port_name),
                                   {port});
            if (sources.size() > 1)
                throw VarException(
                    ::format("{0}.{1} is driven by multiple nets", target_name, port_name), {port});
            // add it to the port mapping and we are good to go
            auto const &stmt = *sources.begin();
            port_mapping_.emplace(port, stmt->right());
            if (parent->debug) {
                port_debug_.emplace(port, stmt.get());
            }
            // add it to the mapping list
            connection_stmt_.emplace(stmt.get());
            // remove it from the parent
            stmt->remove_from_parent();
        } else {
            // you need to run a de-slice pass on the module references first
            throw InternalException(
                "Input slices not supported in the statement. "
                "Please run a de-couple pass first");
        }
    } else if (port_direction == PortDirection::Out) {
        // need to find out if there is any sources connected to the slices
        const auto &slices = filter_slice_pairs_with_target(port->get_slices(), parent, true);
        const auto &sinks = filter_assignments_with_target(port->sinks(), parent, true);
        if (slices.empty()) {
            if (!sinks.empty() && sinks.size() == 1) {
                auto stmt = *sinks.begin();
                port_mapping_.emplace(port, stmt->left());
                stmt->remove_from_parent();
                if (parent->debug) {
                    port_debug_.emplace(port, stmt.get());
                }
            } else if (!sinks.empty() && sinks.size() > 1) {
                throw InternalException(
                    "Multiple outputs not supported in the statement. "
                    "Please run a de-couple pass first");
            }
        } else {
            throw InternalException(
                "Output slices not supported in the statement. "
                "Please run a de-couple pass first");
        }
    } else {
        throw InternalException("Inout port type not implemented");
    }
}